

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

unique_ptr<vm::VM,_std::default_delete<vm::VM>_> __thiscall vm::VM::make_vm(VM *this,File *file)

{
  pointer *ppIVar1;
  ushort uVar2;
  pointer pFVar3;
  pointer pFVar4;
  pointer pCVar5;
  iterator iVar6;
  int *piVar7;
  _Head_base<0UL,_vm::VM_*,_false> _Var8;
  int iVar9;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar10;
  VM *this_00;
  int *piVar11;
  undefined8 *puVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  pointer pFVar17;
  __single_object vm;
  _Head_base<0UL,_vm::VM_*,_false> local_f8;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> *local_f0;
  uint *local_e8;
  undefined8 local_e0;
  uint local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  uint *local_c8;
  undefined8 local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  undefined8 local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  _Head_base<0UL,_vm::VM_*,_false> local_88;
  File local_80;
  
  pFVar3 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_start;
  pFVar4 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar16 = 0;
  local_88._M_head_impl = this;
  if (pFVar3 != pFVar4) {
    local_f0 = &file->start;
    do {
      pFVar17 = pFVar3 + 1;
      uVar2 = pFVar3->nameIndex;
      pCVar5 = (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(file->constants).
                      super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar5 >> 4) * -0x5555555555555555;
      if (uVar13 < uVar2 || uVar13 - uVar2 == 0) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"function name index out of range","");
        *puVar12 = &PTR__InvalidFile_001247e8;
        puVar12[1] = puVar12 + 3;
        if (local_a8 == &local_98) {
          *(uint *)(puVar12 + 3) = local_98;
          *(undefined4 *)((long)puVar12 + 0x1c) = uStack_94;
          *(undefined4 *)(puVar12 + 4) = uStack_90;
          *(undefined4 *)((long)puVar12 + 0x24) = uStack_8c;
        }
        else {
          puVar12[1] = local_a8;
          puVar12[3] = CONCAT44(uStack_94,local_98);
        }
        puVar12[2] = local_a0;
        local_a0 = 0;
        local_98 = local_98 & 0xffffff00;
        local_a8 = &local_98;
        __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      if ((&pCVar5->type)[(uint)uVar2 * 0x30] != STRING) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"function name not found","");
        *puVar12 = &PTR__InvalidFile_001247e8;
        puVar12[1] = puVar12 + 3;
        if (local_c8 == &local_b8) {
          *(uint *)(puVar12 + 3) = local_b8;
          *(undefined4 *)((long)puVar12 + 0x1c) = uStack_b4;
          *(undefined4 *)(puVar12 + 4) = uStack_b0;
          *(undefined4 *)((long)puVar12 + 0x24) = uStack_ac;
        }
        else {
          puVar12[1] = local_c8;
          puVar12[3] = CONCAT44(uStack_b4,local_b8);
        }
        puVar12[2] = local_c0;
        local_c0 = 0;
        local_b8 = local_b8 & 0xffffff00;
        local_c8 = &local_b8;
        __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      pvVar10 = std::get<0ul,std::__cxx11::string,int,double>
                          ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                            *)((long)&(pCVar5->value).
                                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                      .
                                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                              + (ulong)((uint)uVar2 * 0x30)));
      iVar9 = std::__cxx11::string::compare((char *)pvVar10);
      iVar14 = (int)uVar16;
      if (iVar9 == 0) {
        local_80.version = CONCAT31(local_80.version._1_3_,0xc);
        uVar2 = pFVar3->paramSize;
        local_80._4_4_ = ZEXT24(uVar2);
        local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)local_80.constants.
                              super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        iVar6._M_current =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
          _M_realloc_insert<vm::Instruction>(local_f0,iVar6,(Instruction *)&local_80);
        }
        else {
          (iVar6._M_current)->y = 0;
          uVar16 = (ulong)CONCAT24(uVar2,local_80.version);
          (iVar6._M_current)->op = (char)uVar16;
          *(int3 *)&(iVar6._M_current)->field_0x1 = (int3)(uVar16 >> 8);
          (iVar6._M_current)->x = (int)(uVar16 >> 0x20);
          ppIVar1 = &(file->start).
                     super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        local_80.version = CONCAT31(local_80.version._1_3_,0x80);
        local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)local_80.constants.
                              super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        iVar6._M_current =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_80._4_4_ = iVar14;
        if (iVar6._M_current ==
            (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
          _M_realloc_insert<vm::Instruction>(local_f0,iVar6,(Instruction *)&local_80);
        }
        else {
          (iVar6._M_current)->y = 0;
          (iVar6._M_current)->op = 0x80;
          *(undefined3 *)&(iVar6._M_current)->field_0x1 = local_80.version._1_3_;
          (iVar6._M_current)->x = iVar14;
          ppIVar1 = &(file->start).
                     super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
      }
      uVar15 = iVar14 + (uint)(iVar9 != 0);
      uVar16 = (ulong)uVar15;
    } while ((iVar9 != 0) && (pFVar3 = pFVar17, pFVar17 != pFVar4));
    uVar16 = (ulong)uVar15;
  }
  pFVar3 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)(file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 5 != uVar16) {
    this_00 = (VM *)operator_new(0xf8);
    local_80.version = file->version;
    local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_start =
         (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_start =
         (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
    super__Vector_impl_data._M_start = pFVar3;
    VM(this_00,&local_80);
    local_f8._M_head_impl = this_00;
    std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_80.functions);
    if (local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.start.
                      super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.start.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.start.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_80.constants);
    piVar11 = (int *)operator_new__(0x3fffffc);
    memset(piVar11,0,0x3fffffc);
    piVar7 = ((local_f8._M_head_impl)->_stack)._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    ((local_f8._M_head_impl)->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar11;
    if (piVar7 != (int *)0x0) {
      operator_delete__(piVar7);
    }
    piVar11 = (int *)operator_new__(0x3fffffc);
    memset(piVar11,0,0x3fffffc);
    piVar7 = ((local_f8._M_head_impl)->_heap)._M_t.
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    ((local_f8._M_head_impl)->_heap)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar11;
    if (piVar7 != (int *)0x0) {
      operator_delete__(piVar7);
    }
    _Var8._M_head_impl = local_88._M_head_impl;
    *(VM **)local_88._M_head_impl = local_f8._M_head_impl;
    local_f8._M_head_impl = (VM *)0x0;
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)&local_f8);
    return (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)
           (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)_Var8._M_head_impl;
  }
  puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"main not found","");
  *puVar12 = &PTR__InvalidFile_001247e8;
  puVar12[1] = puVar12 + 3;
  if (local_e8 == &local_d8) {
    *(uint *)(puVar12 + 3) = local_d8;
    *(undefined4 *)((long)puVar12 + 0x1c) = uStack_d4;
    *(undefined4 *)(puVar12 + 4) = uStack_d0;
    *(undefined4 *)((long)puVar12 + 0x24) = uStack_cc;
  }
  else {
    puVar12[1] = local_e8;
    puVar12[3] = CONCAT44(uStack_d4,local_d8);
  }
  puVar12[2] = local_e0;
  local_e0 = 0;
  local_d8 = local_d8 & 0xffffff00;
  local_e8 = &local_d8;
  __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
}

Assistant:

std::unique_ptr<VM> VM::make_vm(File file) {
    // found main function
    vm::u4 mainIndex = 0;
    bool mainFound = false;
    for (auto& fun : file.functions) {
        if (0 > fun.nameIndex || fun.nameIndex >= file.constants.size()) {
            throw InvalidFile("function name index out of range");
        }
        if (auto& constant = file.constants.at(fun.nameIndex); constant.type == vm::Constant::Type::STRING) {
            if (std::get<vm::str_t>(constant.value) == "main") {
                file.start.push_back(Instruction{OpCode::snew, fun.paramSize});
                file.start.push_back(Instruction{OpCode::call, mainIndex});
                break;
            }
        }
        else {
            throw InvalidFile("function name not found");
        }
        ++mainIndex;
    }
    if (mainIndex == file.functions.size()) {
        throw InvalidFile("main not found");
    }
    auto vm = std::make_unique<VM>(std::move(file));
    vm->_stack = std::make_unique<slot_t[]>(MAX_STACK_ADDR-MIN_STACK_ADDR);
    vm->_heap  = std::make_unique<slot_t[]>(MAX_HEAP_ADDR-MIN_HEAP_ADDR);
    return std::move(vm);
}